

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Bad.c
# Opt level: O1

DdNode * Llb_BddQuantifyPis(Aig_Man_t *pInit,DdManager *dd,DdNode *bFunc)

{
  abctime aVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  
  iVar2 = Cudd_ReadSize(dd);
  if (iVar2 != pInit->nObjs[2]) {
    __assert_fail("Cudd_ReadSize(dd) == Aig_ManCiNum(pInit)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Bad.c"
                  ,0x73,"DdNode *Llb_BddQuantifyPis(Aig_Man_t *, DdManager *, DdNode *)");
  }
  aVar1 = dd->TimeStop;
  dd->TimeStop = 0;
  pDVar3 = Cudd_ReadOne(dd);
  Cudd_Ref(pDVar3);
  if (0 < pInit->nTruePis) {
    iVar2 = 0;
    pDVar4 = pDVar3;
    do {
      if (pInit->vCis->nSize <= iVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pDVar3 = Cudd_bddIthVar(dd,pInit->nRegs + iVar2);
      pDVar3 = Cudd_bddAnd(dd,pDVar4,pDVar3);
      Cudd_Ref(pDVar3);
      Cudd_RecursiveDeref(dd,pDVar4);
      iVar2 = iVar2 + 1;
      pDVar4 = pDVar3;
    } while (iVar2 < pInit->nTruePis);
  }
  pDVar4 = Cudd_bddExistAbstract(dd,bFunc,pDVar3);
  Cudd_Ref(pDVar4);
  Cudd_RecursiveDeref(dd,pDVar3);
  Cudd_Deref(pDVar4);
  dd->TimeStop = aVar1;
  return pDVar4;
}

Assistant:

DdNode * Llb_BddQuantifyPis( Aig_Man_t * pInit, DdManager * dd, DdNode * bFunc )
{
    DdNode * bVar, * bCube, * bTemp;
    Aig_Obj_t * pObj;
    int i;
    abctime TimeStop;
    assert( Cudd_ReadSize(dd) == Aig_ManCiNum(pInit) );
    TimeStop = dd->TimeStop; dd->TimeStop = 0;
    // create PI cube
    bCube = Cudd_ReadOne( dd );  Cudd_Ref( bCube );
    Saig_ManForEachPi( pInit, pObj, i )    {
        bVar  = Cudd_bddIthVar( dd, Aig_ManRegNum(pInit) + i );
        bCube = Cudd_bddAnd( dd, bTemp = bCube, bVar );  Cudd_Ref( bCube );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    // quantify PI cube
    bFunc = Cudd_bddExistAbstract( dd, bFunc, bCube );  Cudd_Ref( bFunc );
    Cudd_RecursiveDeref( dd, bCube );
    Cudd_Deref( bFunc );
    dd->TimeStop = TimeStop;
    return bFunc;
}